

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

SRes SZIP_ISeekInStream_Seek(void *p,Int64 *pos,ESzSeek origin)

{
  long lVar1;
  long lVar2;
  int iVar3;
  PHYSFS_uint64 newpos;
  PHYSFS_sint64 base;
  PHYSFS_Io *io;
  SZIPLookToRead *stream;
  ESzSeek origin_local;
  Int64 *pos_local;
  void *p_local;
  
  lVar1 = *(long *)((long)p + 0x10);
  if (origin == SZ_SEEK_SET) {
    newpos = 0;
  }
  else if (origin == SZ_SEEK_CUR) {
    newpos = (**(code **)(lVar1 + 0x28))(lVar1);
  }
  else {
    if (origin != SZ_SEEK_END) {
      return 0xb;
    }
    newpos = (**(code **)(lVar1 + 0x30))(lVar1);
  }
  if ((long)newpos < 0) {
    p_local._4_4_ = 0xb;
  }
  else if ((*pos < 0) && ((long)newpos < -*pos)) {
    p_local._4_4_ = 0xb;
  }
  else {
    lVar2 = *pos;
    iVar3 = (**(code **)(lVar1 + 0x20))(lVar1,newpos + lVar2);
    if (iVar3 == 0) {
      p_local._4_4_ = 0xb;
    }
    else {
      *pos = newpos + lVar2;
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static SRes SZIP_ISeekInStream_Seek(void *p, Int64 *pos, ESzSeek origin)
{
    SZIPLookToRead *stream = (SZIPLookToRead *) p;
    PHYSFS_Io *io = stream->io;
    PHYSFS_sint64 base;
    PHYSFS_uint64 newpos;

    switch (origin)
    {
        case SZ_SEEK_SET:
            base = 0;
            break;

        case SZ_SEEK_CUR:
            base = io->tell(io);
            break;

        case SZ_SEEK_END:
            base = io->length(io);
            break;

        default:
            return SZ_ERROR_FAIL;
    } /* switch */

    if (base < 0)
        return SZ_ERROR_FAIL;
    else if ((*pos < 0) && (((Int64) base) < -*pos))
        return SZ_ERROR_FAIL;

    newpos = (PHYSFS_uint64) (((Int64) base) + *pos);
    if (!io->seek(io, newpos))
        return SZ_ERROR_FAIL;

    *pos = (Int64) newpos;
    return SZ_OK;
}